

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O2

void test_common<signed_char>(uint length,char value)

{
  ulong uVar1;
  _func_int ***ppp_Var2;
  uint i;
  char *pcVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  int iVar8;
  char *local_50;
  shared_ptr<signed_char> pa;
  shared_ptr<signed_char> pb;
  
  uVar1 = (ulong)length;
  pcVar3 = nosimd::common::malloc<signed_char>(length + 1);
  std::__shared_ptr<signed_char,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<signed_char,void(*)(signed_char*),void>
            ((__shared_ptr<signed_char,(__gnu_cxx::_Lock_policy)2> *)&local_50,pcVar3,
             nosimd::common::free<signed_char>);
  pcVar3 = nosimd::common::malloc<signed_char>(length + 1);
  std::__shared_ptr<signed_char,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<signed_char,void(*)(signed_char*),void>
            ((__shared_ptr<signed_char,(__gnu_cxx::_Lock_policy)2> *)
             &pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pcVar3,
             nosimd::common::free<signed_char>);
  local_50[uVar1] = '\x7f';
  *(undefined1 *)
   ((long)&(pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar1) = 0x3f;
  nosimd::common::set<signed_char>(value,local_50,length);
  uVar5 = 0;
  while (uVar1 != uVar5) {
    pcVar3 = local_50 + uVar5;
    uVar5 = uVar5 + 1;
    if (*pcVar3 != value) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
      *(undefined4 *)(puVar4 + 1) = 0x16;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::common::copy<signed_char>
            (local_50,(char *)pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,length);
  uVar5 = 0;
  while (uVar1 != uVar5) {
    pcVar3 = (char *)((long)&(pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pcVar3 != value) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
      *(undefined4 *)(puVar4 + 1) = 0x1d;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<signed_char>
            ((char *)pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi,length);
  uVar5 = 0;
  while (uVar1 != uVar5) {
    pcVar3 = (char *)((long)&(pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pcVar3 != '\0') {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
      *(undefined4 *)(puVar4 + 1) = 0x24;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    local_50[uVar5] = (char)uVar5;
  }
  nosimd::common::copy<signed_char>
            (local_50,(char *)pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,length);
  lVar6 = 0;
  _Var7 = pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  while (uVar1 << 0x18 != lVar6) {
    ppp_Var2 = &(_Var7._M_pi)->_vptr__Sp_counted_base;
    iVar8 = (int)lVar6;
    lVar6 = lVar6 + 0x1000000;
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&(_Var7._M_pi)->_vptr__Sp_counted_base + 1);
    if (iVar8 >> 0x18 != (int)*(char *)ppp_Var2) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
      *(undefined4 *)(puVar4 + 1) = 0x2d;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  if ((local_50[uVar1] == '\x7f') &&
     (*(char *)((long)&(pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_vptr__Sp_counted_base + uVar1) == '?')) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
  *(undefined4 *)(puVar4 + 1) = 0x31;
  *(uint *)((long)puVar4 + 0xc) = length;
  __cxa_throw(puVar4,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}